

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# watsonVM.c
# Opt level: O2

VM newBufferVM(Lexer lexer,char *buf,size_t len)

{
  VM pvVar1;
  
  pvVar1 = newVM(lexer);
  pvVar1->destType = Buffer;
  (pvVar1->dest).buffer.buf = buf;
  (pvVar1->dest).buffer.max = len;
  (pvVar1->dest).buffer.used = 0;
  return pvVar1;
}

Assistant:

VM newBufferVM(Lexer lexer, char *buf, size_t len) {
    VM v = newVM(lexer);
    v->destType = Buffer;
    v->dest.buffer.buf = buf;
    v->dest.buffer.max = len;
    v->dest.buffer.used = 0;
    return v;
}